

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

uint GetNextFuzzyBits(uchar *buffer,uint offset_begin,uint offset_end,bool bSearchForFuzzy)

{
  byte *pbVar1;
  
  if (offset_begin < offset_end) {
    pbVar1 = buffer + offset_begin;
    do {
      if (bSearchForFuzzy) {
        if ((*pbVar1 & 4) != 0) {
          return offset_begin;
        }
      }
      else if ((*pbVar1 & 4) == 0) {
        return offset_begin;
      }
      offset_begin = offset_begin + 1;
      pbVar1 = pbVar1 + 1;
    } while (offset_end != offset_begin);
  }
  return 0xffffffff;
}

Assistant:

unsigned int GetNextFuzzyBits(unsigned char* buffer, unsigned int offset_begin, unsigned int offset_end,
                              bool bSearchForFuzzy)
{
   //
   while (offset_begin < offset_end)
   {
      if (bSearchForFuzzy)
      {
         if (buffer[offset_begin] & BIT_WEAK)
         {
            // Found !
            return offset_begin;
         }
      }
      else
      {
         if ((buffer[offset_begin] & BIT_WEAK) == 0)
         {
            // Found !
            return offset_begin;
         }
      }

      offset_begin++;
   }
   return -1;
}